

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O0

DFA<covenant::Sym> * __thiscall
covenant::CycleBreakingAbstract<covenant::Sym>::do_abstraction
          (CycleBreakingAbstract<covenant::Sym> *this,CFG *g,bool is_regular)

{
  size_type sVar1;
  undefined8 uVar2;
  string *msg;
  byte in_CL;
  DFA<covenant::Sym> *in_RDI;
  bool bVar3;
  bool is_not_empty;
  DFA<covenant::Sym> dfa;
  StronglyRegularToFA<covenant::Sym> conv_1;
  CFG str_reg_cfg;
  CycleBreaking<covenant::Sym> transformer;
  StronglyRegularToFA<covenant::Sym> conv;
  DFA<covenant::Sym> sfa;
  bool is_abs_done;
  DFA<covenant::Sym> *min_dfa;
  CFG *in_stack_fffffffffffff688;
  StronglyRegularToFA<covenant::Sym> *in_stack_fffffffffffff690;
  allocator *paVar4;
  key_type *in_stack_fffffffffffff698;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff6a0;
  undefined7 in_stack_fffffffffffff6a8;
  undefined1 in_stack_fffffffffffff6af;
  CFG *in_stack_fffffffffffff6b0;
  allocator local_8d9;
  string local_8d8 [32];
  undefined6 in_stack_fffffffffffff748;
  undefined1 in_stack_fffffffffffff74e;
  allocator in_stack_fffffffffffff74f;
  string local_8b0 [38];
  undefined1 local_88a;
  undefined1 local_889;
  CFG *in_stack_fffffffffffff7c0;
  CycleBreaking<covenant::Sym> *in_stack_fffffffffffff7c8;
  DFA<covenant::Sym> *in_stack_fffffffffffff7e0;
  DFA<covenant::Sym> *in_stack_fffffffffffff828;
  uint in_stack_fffffffffffffa70;
  uint in_stack_fffffffffffffa74;
  DFA<covenant::Sym> *in_stack_fffffffffffffa78;
  allocator local_4d9;
  string local_4d8 [104];
  uint in_stack_fffffffffffffb90;
  uint in_stack_fffffffffffffb94;
  DFA<covenant::Sym> *in_stack_fffffffffffffb98;
  allocator local_3b1;
  string local_3b0 [136];
  CFG *in_stack_fffffffffffffcd8;
  StronglyRegularToFA<covenant::Sym> *in_stack_fffffffffffffce0;
  allocator local_d1;
  string local_d0 [182];
  byte local_1a;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  CFG::getTermFactory(in_stack_fffffffffffff688);
  DFA<covenant::Sym>::DFA
            ((DFA<covenant::Sym> *)in_stack_fffffffffffff690,
             (TermFactory *)in_stack_fffffffffffff688);
  boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
            ((shared_ptr<covenant::TerminalFactory> *)0x21c9c6);
  if ((local_19 & 1) == 0) {
    bVar3 = false;
    if ((avy::AvyLogFlag & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3b0,"verbose",&local_3b1);
      sVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
      bVar3 = sVar1 != 0;
      std::__cxx11::string::~string(local_3b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    }
    if (bVar3) {
      std::operator<<((ostream *)&std::cout,"Applied cycle breaking abstraction.\n");
    }
    local_1a = 1;
    CFG::CFG(in_stack_fffffffffffff6b0,
             (CFG *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
    CycleBreaking<covenant::Sym>::Approximate(in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
    CFG::~CFG(&in_stack_fffffffffffff690->g);
    bVar3 = false;
    if ((avy::AvyLogFlag & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4d8,"abstraction",&local_4d9);
      sVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
      bVar3 = sVar1 != 0;
      std::__cxx11::string::~string(local_4d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d9);
    }
    if (bVar3) {
      in_stack_fffffffffffff6b0 =
           (CFG *)std::operator<<((ostream *)&std::cout,"Approximated regular grammar:\n");
      CFG::CFG(in_stack_fffffffffffff6b0,
               (CFG *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
      covenant::operator<<((ostream *)in_stack_fffffffffffff690,in_stack_fffffffffffff688);
      CFG::~CFG(&in_stack_fffffffffffff690->g);
    }
    CFG::CFG(in_stack_fffffffffffff6b0,
             (CFG *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
    StronglyRegularToFA<covenant::Sym>::StronglyRegularToFA
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    CFG::~CFG(&in_stack_fffffffffffff690->g);
    StronglyRegularToFA<covenant::Sym>::make_fa
              ((StronglyRegularToFA<covenant::Sym> *)
               CONCAT17(in_stack_fffffffffffff74f,
                        CONCAT16(in_stack_fffffffffffff74e,in_stack_fffffffffffff748)));
    DFA<covenant::Sym>::operator=
              ((DFA<covenant::Sym> *)in_stack_fffffffffffff690,
               (DFA<covenant::Sym> *)in_stack_fffffffffffff688);
    DFA<covenant::Sym>::~DFA((DFA<covenant::Sym> *)in_stack_fffffffffffff690);
    StronglyRegularToFA<covenant::Sym>::~StronglyRegularToFA(in_stack_fffffffffffff690);
    CFG::~CFG(&in_stack_fffffffffffff690->g);
  }
  else {
    bVar3 = false;
    if ((avy::AvyLogFlag & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"verbose",&local_d1);
      sVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(in_stack_fffffffffffff6a0,in_stack_fffffffffffff698);
      bVar3 = sVar1 != 0;
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    }
    if (bVar3) {
      std::operator<<((ostream *)&std::cout,"The CFG is regular thus no need to abstract.\n");
    }
    CFG::CFG(in_stack_fffffffffffff6b0,
             (CFG *)CONCAT17(in_stack_fffffffffffff6af,in_stack_fffffffffffff6a8));
    StronglyRegularToFA<covenant::Sym>::StronglyRegularToFA
              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    CFG::~CFG(&in_stack_fffffffffffff690->g);
    StronglyRegularToFA<covenant::Sym>::make_fa
              ((StronglyRegularToFA<covenant::Sym> *)
               CONCAT17(in_stack_fffffffffffff74f,
                        CONCAT16(in_stack_fffffffffffff74e,in_stack_fffffffffffff748)));
    DFA<covenant::Sym>::operator=
              ((DFA<covenant::Sym> *)in_stack_fffffffffffff690,
               (DFA<covenant::Sym> *)in_stack_fffffffffffff688);
    DFA<covenant::Sym>::~DFA((DFA<covenant::Sym> *)in_stack_fffffffffffff690);
    StronglyRegularToFA<covenant::Sym>::~StronglyRegularToFA(in_stack_fffffffffffff690);
  }
  DFA<covenant::Sym>::eps_elim(in_stack_fffffffffffff7e0);
  DFA<covenant::Sym>::makeDFA
            (in_stack_fffffffffffffb98,in_stack_fffffffffffffb94,in_stack_fffffffffffffb90);
  local_889 = 0;
  DFA<covenant::Sym>::minimize
            (in_stack_fffffffffffffa78,in_stack_fffffffffffffa74,in_stack_fffffffffffffa70);
  local_88a = DFA<covenant::Sym>::eliminateDeadStates(in_stack_fffffffffffff828);
  if (!(bool)local_88a) {
    if ((local_1a & 1) == 0) {
      uVar2 = __cxa_allocate_exception(0x20);
      paVar4 = (allocator *)&stack0xfffffffffffff74f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_8b0,"One CFG is trivially empty.\n======\nUNSAT\n======",paVar4);
      Exit::Exit((Exit *)in_stack_fffffffffffff690,(string *)in_stack_fffffffffffff688);
      __cxa_throw(uVar2,&Exit::typeinfo,Exit::~Exit);
    }
    msg = (string *)__cxa_allocate_exception(0x20);
    paVar4 = &local_8d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_8d8,"One CFG is empty after abstraction.\n======\nUNSAT\n======",paVar4);
    Exit::Exit((Exit *)paVar4,msg);
    __cxa_throw(msg,&Exit::typeinfo,Exit::~Exit);
  }
  local_889 = 1;
  DFA<covenant::Sym>::~DFA((DFA<covenant::Sym> *)in_stack_fffffffffffff690);
  DFA<covenant::Sym>::~DFA((DFA<covenant::Sym> *)in_stack_fffffffffffff690);
  return in_RDI;
}

Assistant:

DFA<EdgeSym> do_abstraction(CFG &g, const bool is_regular)
  {
    bool is_abs_done = false;
    DFA<EdgeSym> sfa (g.getTermFactory ());
    if (is_regular)
    {        
      LOG( "verbose", cout << "The CFG is regular thus no need to abstract.\n");

      StronglyRegularToFA<EdgeSym>  conv(g);
      sfa = conv.make_fa();
    }
    else
    {
      LOG( "verbose" , cout << "Applied cycle breaking abstraction.\n");
      is_abs_done = true;
      CycleBreaking<EdgeSym> transformer;
      CFG str_reg_cfg = transformer.Approximate(g);

      LOG ("abstraction" , 
           cout << "Approximated regular grammar:\n" << str_reg_cfg);

      StronglyRegularToFA<EdgeSym> conv(str_reg_cfg);
      sfa = conv.make_fa();
    }

    /// Simplify the automata
    sfa.eps_elim();

    DFA<EdgeSym> dfa     = sfa.makeDFA (g.alphstart, g.alphsz);
    DFA<EdgeSym> min_dfa = dfa.minimize (g.alphstart, g.alphsz);
    bool is_not_empty    = min_dfa.eliminateDeadStates();
    if (!is_not_empty)
    {
      if  (!is_abs_done) 
        throw Exit("One CFG is trivially empty.\n======\nUNSAT\n======");
      else
        throw Exit("One CFG is empty after abstraction.\n======\nUNSAT\n======");
    }
    return min_dfa;
  }